

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O1

int SZ_BufftoBuffDecompress
              (void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  uint uVar1;
  uint uVar2;
  int i;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uchar *__src;
  sbyte sVar7;
  int iVar8;
  int iVar9;
  uchar *puVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uchar *src8;
  size_t __size;
  size_t __n;
  ulong uVar14;
  uchar *__dest;
  aec_stream_conflict local_280;
  uint local_238 [16];
  undefined4 local_1f8;
  undefined4 local_1b8;
  
  uVar1 = param->pixels_per_block;
  uVar6 = (ulong)uVar1;
  iVar5 = param->pixels_per_scanline;
  uVar3 = (int)(iVar5 + uVar1 + -1) / (int)uVar1;
  uVar2 = param->options_mask;
  uVar13 = 0;
  local_280.block_size = uVar1;
  local_280.rsi = uVar3;
  memset(local_238,0,0x204);
  local_1f8 = 4;
  local_1b8 = 8;
  uVar4 = 1;
  do {
    if ((uVar4 & uVar2) != 0) {
      uVar13 = uVar13 | local_238[(int)uVar4];
    }
    uVar4 = uVar4 * 2;
  } while ((int)uVar4 < 0x81);
  iVar8 = iVar5 % (int)uVar1;
  uVar2 = param->bits_per_pixel;
  uVar4 = 8;
  if ((uVar2 != 0x20) && (uVar2 != 0x40)) {
    uVar4 = uVar2;
  }
  local_280.next_in = (uchar *)source;
  local_280.avail_in = sourceLen;
  local_280.bits_per_sample = uVar4;
  local_280.flags = uVar13;
  if (iVar8 == 0) {
    if ((uVar2 == 0x40) || (uVar2 == 0x20)) {
      __size = *destLen;
      goto LAB_001297a3;
    }
    __size = *destLen;
    __src = (uchar *)0x0;
    puVar10 = (uchar *)dest;
  }
  else {
    sVar7 = 2;
    if ((int)uVar4 < 0x11) {
      sVar7 = 8 < (int)uVar4;
    }
    uVar6 = (((long)iVar5 + (*destLen >> sVar7)) - 1) / (ulong)(long)iVar5;
    __size = (uVar3 * uVar1 << sVar7) * uVar6;
LAB_001297a3:
    __src = (uchar *)malloc(__size);
    puVar10 = __src;
    if (__src == (uchar *)0x0) {
      iVar5 = -4;
      goto LAB_00129975;
    }
  }
  local_280.next_out = puVar10;
  local_280.avail_out = __size;
  iVar5 = aec_buffer_decode(&local_280);
  if (iVar5 == 0) {
    if (iVar8 != 0) {
      iVar5 = param->pixels_per_scanline;
      sVar7 = 8 < (int)uVar4;
      if (0x10 < (int)uVar4) {
        sVar7 = 2;
      }
      __n = (size_t)(iVar5 << sVar7);
      uVar11 = (local_280.block_size * local_280.rsi - iVar5 << sVar7) + __n;
      puVar10 = __src;
      __dest = __src;
      for (uVar14 = uVar11; uVar14 < local_280.total_out; uVar14 = uVar14 + uVar11) {
        puVar10 = puVar10 + uVar11;
        __dest = __dest + __n;
        memmove(__dest,puVar10,__n);
      }
      sVar7 = 8 < (int)uVar4;
      if (0x10 < (int)uVar4) {
        sVar7 = 2;
      }
      local_280.total_out = uVar6 * (long)iVar5 << sVar7;
    }
    if (local_280.total_out < *destLen) {
      *destLen = local_280.total_out;
    }
    if ((uVar2 == 0x40) || (uVar2 == 0x20)) {
      iVar5 = param->bits_per_pixel;
      iVar9 = iVar5 + 7;
      if (-1 < iVar5) {
        iVar9 = iVar5;
      }
      uVar14 = (ulong)(iVar9 >> 3);
      iVar5 = 0;
      uVar6 = *destLen / uVar14;
      if (uVar14 <= *destLen) {
        uVar11 = 0;
        do {
          lVar12 = 0;
          do {
            *(uchar *)((long)dest + lVar12) = __src[lVar12 * uVar6 + uVar11];
            lVar12 = lVar12 + 1;
          } while (uVar14 + (uVar14 == 0) != lVar12);
          uVar11 = uVar11 + 1;
          dest = (void *)((long)dest + uVar14);
        } while (uVar11 < uVar6);
        iVar5 = 0;
      }
    }
    else {
      iVar5 = 0;
      if (iVar8 != 0) {
        memcpy(dest,__src,*destLen);
      }
    }
  }
LAB_00129975:
  if ((iVar8 != 0 || (uVar2 == 0x40 || uVar2 == 0x20)) && __src != (uchar *)0x0) {
    free(__src);
  }
  return iVar5;
}

Assistant:

int SZ_BufftoBuffDecompress(void *dest, size_t *destLen,
                            const void *source, size_t sourceLen,
                            SZ_com_t *param)
{
    struct aec_stream strm;
    int status;
    size_t total_out;
    size_t scanlines;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = convert_options(param->options_mask);
    strm.avail_in = sourceLen;
    strm.next_in = source;
    void *buf = 0;

    int pad_scanline = param->pixels_per_scanline % param->pixels_per_block;
    int deinterleave = (param->bits_per_pixel == 32
                        || param->bits_per_pixel == 64);
    int extra_buffer = pad_scanline || deinterleave;
    int pixel_size;

    if (deinterleave)
        strm.bits_per_sample = 8;
    else
        strm.bits_per_sample = param->bits_per_pixel;
    pixel_size = bits_to_bytes(strm.bits_per_sample);


    if (extra_buffer) {
        size_t buf_size;
        if (pad_scanline) {
            scanlines = (*destLen / pixel_size + param->pixels_per_scanline - 1)
                / param->pixels_per_scanline;
            buf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
        } else {
            buf_size = *destLen;
        }
        buf = malloc(buf_size);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        strm.next_out = buf;
        strm.avail_out = buf_size;
    } else {
        strm.next_out = dest;
        strm.avail_out = *destLen;
    }

    status = aec_buffer_decode(&strm);
    if (status != AEC_OK)
        goto CLEANUP;

    if (pad_scanline) {
        size_t padding_size =
            (strm.rsi * strm.block_size - param->pixels_per_scanline)
            * pixel_size;
        remove_padding(buf, strm.total_out,
                       param->pixels_per_scanline * pixel_size,
                       padding_size, pixel_size);
        total_out = scanlines * param->pixels_per_scanline * pixel_size;
    } else {
        total_out = strm.total_out;
    }

    if (total_out < *destLen)
        *destLen = total_out;

    if (deinterleave)
        deinterleave_buffer(dest, buf, *destLen, param->bits_per_pixel / 8);
    else if (pad_scanline)
        memcpy(dest, buf, *destLen);

CLEANUP:
    if (extra_buffer && buf)
        free(buf);

    return status;
}